

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O0

void Assimp::IFC::InsertWindowContours
               (ContourVector *contours,
               vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *param_2,
               TempMesh *curmesh)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  BoundingBox *pBVar4;
  const_reference pvVar5;
  size_type sVar6;
  const_reference pvVar7;
  pair<std::_Rb_tree_const_iterator<aiVector2t<double>_>,_bool> pVar8;
  aiVector2t<double> aVar9;
  size_t local_260;
  bool local_239;
  undefined1 local_210 [28];
  value_type_conflict4 local_1f4;
  long local_1f0;
  size_t d;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_1e0;
  const_iterator local_1d8;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_1d0;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  local_1c8;
  const_iterator local_1c0;
  aiVector3t<double> local_1b8;
  double local_1a0;
  IfcVector2 corner;
  aiVector2t<double> local_178;
  ulong local_168;
  size_t e_1;
  size_t a;
  size_t cnt;
  size_t old;
  const_reference pvStack_140;
  bool hit;
  IfcVector2 *v;
  size_t size;
  size_t e;
  size_t n_1;
  IfcVector2 edge;
  size_t very_first_hit;
  size_t last_hit;
  IfcFloat epsilon;
  double local_f0;
  double local_e8;
  IfcFloat diag;
  aiVector2t<double> local_d8;
  _Self local_c8;
  aiVector2t<double> local_c0;
  _Self local_b0;
  _Self local_a8;
  _Self local_a0;
  _Self local_98;
  const_iterator end;
  ulong local_70;
  size_t n;
  set<aiVector2t<double>,_Assimp::IFC::XYSorter,_std::allocator<aiVector2t<double>_>_> verts;
  vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *contour;
  BoundingBox *bb;
  size_t i;
  TempMesh *curmesh_local;
  vector<Assimp::IFC::TempOpening,_std::allocator<Assimp::IFC::TempOpening>_> *param_1_local;
  ContourVector *contours_local;
  
  bb = (BoundingBox *)0x0;
  do {
    pBVar4 = (BoundingBox *)
             std::
             vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
             ::size(contours);
    if (pBVar4 <= bb) {
      return;
    }
    pvVar5 = std::
             vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
             ::operator[](contours,(size_type)bb);
    pBVar4 = &pvVar5->bb;
    verts._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::
                 vector<Assimp::IFC::ProjectedWindowContour,_std::allocator<Assimp::IFC::ProjectedWindowContour>_>
                 ::operator[](contours,(size_type)bb);
    bVar3 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::empty
                      ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
                       verts._M_t._M_impl.super__Rb_tree_header._M_node_count);
    if (!bVar3) {
      sVar6 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::size
                        ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
                         verts._M_t._M_impl.super__Rb_tree_header._M_node_count);
      if (sVar6 == 4) {
        std::set<aiVector2t<double>,_Assimp::IFC::XYSorter,_std::allocator<aiVector2t<double>_>_>::
        set((set<aiVector2t<double>,_Assimp::IFC::XYSorter,_std::allocator<aiVector2t<double>_>_> *)
            &n);
        for (local_70 = 0; local_70 < 4; local_70 = local_70 + 1) {
          pvVar7 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::operator[]
                             ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
                              verts._M_t._M_impl.super__Rb_tree_header._M_node_count,local_70);
          pVar8 = std::
                  set<aiVector2t<double>,_Assimp::IFC::XYSorter,_std::allocator<aiVector2t<double>_>_>
                  ::insert((set<aiVector2t<double>,_Assimp::IFC::XYSorter,_std::allocator<aiVector2t<double>_>_>
                            *)&n,pvVar7);
          end._M_node = (_Base_ptr)pVar8.first._M_node;
        }
        local_98._M_node =
             (_Base_ptr)
             std::
             set<aiVector2t<double>,_Assimp::IFC::XYSorter,_std::allocator<aiVector2t<double>_>_>::
             end((set<aiVector2t<double>,_Assimp::IFC::XYSorter,_std::allocator<aiVector2t<double>_>_>
                  *)&n);
        local_a0._M_node =
             (_Base_ptr)
             std::
             set<aiVector2t<double>,_Assimp::IFC::XYSorter,_std::allocator<aiVector2t<double>_>_>::
             find((set<aiVector2t<double>,_Assimp::IFC::XYSorter,_std::allocator<aiVector2t<double>_>_>
                   *)&n,&pBVar4->first);
        bVar3 = std::operator!=(&local_a0,&local_98);
        local_239 = false;
        if (bVar3) {
          local_a8._M_node =
               (_Base_ptr)
               std::
               set<aiVector2t<double>,_Assimp::IFC::XYSorter,_std::allocator<aiVector2t<double>_>_>
               ::find((set<aiVector2t<double>,_Assimp::IFC::XYSorter,_std::allocator<aiVector2t<double>_>_>
                       *)&n,&(pvVar5->bb).second);
          bVar3 = std::operator!=(&local_a8,&local_98);
          local_239 = false;
          if (bVar3) {
            aiVector2t<double>::aiVector2t(&local_c0,(pBVar4->first).x,(pvVar5->bb).second.y);
            local_b0._M_node =
                 (_Base_ptr)
                 std::
                 set<aiVector2t<double>,_Assimp::IFC::XYSorter,_std::allocator<aiVector2t<double>_>_>
                 ::find((set<aiVector2t<double>,_Assimp::IFC::XYSorter,_std::allocator<aiVector2t<double>_>_>
                         *)&n,&local_c0);
            bVar3 = std::operator!=(&local_b0,&local_98);
            local_239 = false;
            if (bVar3) {
              aiVector2t<double>::aiVector2t(&local_d8,(pvVar5->bb).second.x,(pvVar5->bb).first.y);
              local_c8._M_node =
                   (_Base_ptr)
                   std::
                   set<aiVector2t<double>,_Assimp::IFC::XYSorter,_std::allocator<aiVector2t<double>_>_>
                   ::find((set<aiVector2t<double>,_Assimp::IFC::XYSorter,_std::allocator<aiVector2t<double>_>_>
                           *)&n,&local_d8);
              local_239 = std::operator!=(&local_c8,&local_98);
            }
          }
        }
        if (local_239 == false) {
          diag._4_4_ = 0;
        }
        else {
          diag._4_4_ = 4;
        }
        std::set<aiVector2t<double>,_Assimp::IFC::XYSorter,_std::allocator<aiVector2t<double>_>_>::
        ~set((set<aiVector2t<double>,_Assimp::IFC::XYSorter,_std::allocator<aiVector2t<double>_>_> *
             )&n);
        if (diag._4_4_ != 0) goto LAB_00938c22;
      }
      aVar9 = ::operator-(&pBVar4->first,&(pvVar5->bb).second);
      local_f0 = aVar9.y;
      epsilon = aVar9.x;
      local_e8 = aiVector2t<double>::Length((aiVector2t<double> *)&epsilon);
      dVar1 = local_e8 / 1000.0;
      very_first_hit = 0xffffffffffffffff;
      edge.y = -NAN;
      aiVector2t<double>::aiVector2t((aiVector2t<double> *)&n_1);
      e = 0;
      size = 0;
      v = (IfcVector2 *)
          std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::size
                    ((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
                     verts._M_t._M_impl.super__Rb_tree_header._M_node_count);
      for (; size != (long)v * 2; size = size + 1) {
        pvStack_140 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::
                      operator[]((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *
                                 )verts._M_t._M_impl.super__Rb_tree_header._M_node_count,e);
        if (dVar1 <= ABS(pvStack_140->x - (pBVar4->first).x)) {
          old._7_1_ = ABS(pvStack_140->x - (pvVar5->bb).second.x) < dVar1;
          if ((bool)old._7_1_) {
            n_1 = (size_t)(pvVar5->bb).second.x;
          }
        }
        else {
          n_1 = (size_t)(pBVar4->first).x;
          old._7_1_ = true;
        }
        if (dVar1 <= ABS(pvStack_140->y - (pvVar5->bb).first.y)) {
          if (ABS(pvStack_140->y - (pvVar5->bb).second.y) < dVar1) {
            edge.x = (pvVar5->bb).second.y;
            old._7_1_ = true;
          }
        }
        else {
          edge.x = (pvVar5->bb).first.y;
          old._7_1_ = true;
        }
        if ((bool)old._7_1_ != false) {
          if (very_first_hit == 0xffffffffffffffff) {
            edge.y = (double)e;
          }
          else {
            cnt = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                            (&curmesh->mVerts);
            if (e < very_first_hit) {
              local_260 = (long)v - (very_first_hit - e);
            }
            else {
              local_260 = e - very_first_hit;
            }
            a = local_260;
            e_1 = very_first_hit;
            for (local_168 = 0; local_168 <= a; local_168 = local_168 + 1) {
              pvVar7 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::
                       operator[]((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                   *)verts._M_t._M_impl.super__Rb_tree_header._M_node_count,e_1);
              aVar9 = ::operator-(pvVar7,(aiVector2t<double> *)&n_1);
              local_178.y = aVar9.y;
              local_178.x = aVar9.x;
              dVar2 = aiVector2t<double>::SquareLength(&local_178);
              if (dVar2 <= local_e8 * local_e8 * 0.7) {
                pvVar7 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::
                         operator[]((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                     *)verts._M_t._M_impl.super__Rb_tree_header._M_node_count,e_1);
                dVar2 = pvVar7->x;
                pvVar7 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::
                         operator[]((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                     *)verts._M_t._M_impl.super__Rb_tree_header._M_node_count,e_1);
                aiVector3t<double>::aiVector3t((aiVector3t<double> *)&corner.y,dVar2,pvVar7->y,0.0);
                std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                          (&curmesh->mVerts,(value_type *)&corner.y);
              }
              e_1 = (e_1 + 1) % (ulong)v;
            }
            pvVar7 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::
                     operator[]((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *)
                                verts._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                very_first_hit);
            bVar3 = aiVector2t<double>::operator!=((aiVector2t<double> *)&n_1,pvVar7);
            if (bVar3) {
              local_1a0 = (double)n_1;
              corner.x = edge.x;
              pvVar7 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::
                       operator[]((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                   *)verts._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                  very_first_hit);
              if (dVar1 <= ABS(pvVar7->x - (pBVar4->first).x)) {
                pvVar7 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::
                         operator[]((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                     *)verts._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                    very_first_hit);
                if (ABS(pvVar7->x - (pvVar5->bb).second.x) < dVar1) {
                  local_1a0 = (pvVar5->bb).second.x;
                }
              }
              else {
                local_1a0 = (pBVar4->first).x;
              }
              pvVar7 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::
                       operator[]((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                   *)verts._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                  very_first_hit);
              if (dVar1 <= ABS(pvVar7->y - (pvVar5->bb).first.y)) {
                pvVar7 = std::vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>::
                         operator[]((vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>
                                     *)verts._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                    very_first_hit);
                if (ABS(pvVar7->y - (pvVar5->bb).second.y) < dVar1) {
                  corner.x = (pvVar5->bb).second.y;
                }
              }
              else {
                corner.x = (pvVar5->bb).first.y;
              }
              aiVector3t<double>::aiVector3t(&local_1b8,local_1a0,corner.x,0.0);
              std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::push_back
                        (&curmesh->mVerts,&local_1b8);
            }
            else if (a == 1) {
              local_1d0._M_current =
                   (aiVector3t<double> *)
                   std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::begin
                             (&curmesh->mVerts);
              local_1c8 = __gnu_cxx::
                          __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
                          ::operator+(&local_1d0,cnt);
              __gnu_cxx::
              __normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
              ::__normal_iterator<aiVector3t<double>*>
                        ((__normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
                          *)&local_1c0,&local_1c8);
              local_1e0._M_current =
                   (aiVector3t<double> *)
                   std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::end
                             (&curmesh->mVerts);
              __gnu_cxx::
              __normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
              ::__normal_iterator<aiVector3t<double>*>
                        ((__normal_iterator<aiVector3t<double>const*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>
                          *)&local_1d8,&local_1e0);
              d = (size_t)std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::
                          erase(&curmesh->mVerts,local_1c0,local_1d8);
            }
            sVar6 = std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::size
                              (&curmesh->mVerts);
            local_1f0 = sVar6 - cnt;
            if (local_1f0 != 0) {
              local_1f4 = (value_type_conflict4)local_1f0;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        (&curmesh->mVertcnt,&local_1f4);
              std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::rbegin
                        ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                         (local_210 + 0x10));
              std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::rbegin
                        ((vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *)
                         local_210);
              std::
              reverse_iterator<__gnu_cxx::__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>_>
              ::operator+((reverse_iterator<__gnu_cxx::__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>_>
                           *)(local_210 + 8),(difference_type)local_210);
              std::
              reverse<std::reverse_iterator<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>>>
                        ((reverse_iterator<__gnu_cxx::__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>_>
                          *)(local_210 + 0x10),
                         (reverse_iterator<__gnu_cxx::__normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>_>
                          *)(local_210 + 8));
            }
            if ((double)e == edge.y) goto LAB_00938c22;
          }
          very_first_hit = e;
        }
        e = (e + 1) % (ulong)v;
      }
      LogFunctions<Assimp::IFCImporter>::LogError
                ("encountered unexpected topology while generating window contour");
    }
LAB_00938c22:
    bb = (BoundingBox *)((long)&(bb->first).x + 1);
  } while( true );
}

Assistant:

void InsertWindowContours(const ContourVector& contours,
    const std::vector<TempOpening>& /*openings*/,
    TempMesh& curmesh)
{
    // fix windows - we need to insert the real, polygonal shapes into the quadratic holes that we have now
    for(size_t i = 0; i < contours.size();++i) {
        const BoundingBox& bb = contours[i].bb;
        const std::vector<IfcVector2>& contour = contours[i].contour;
        if(contour.empty()) {
            continue;
        }

        // check if we need to do it at all - many windows just fit perfectly into their quadratic holes,
        // i.e. their contours *are* already their bounding boxes.
        if (contour.size() == 4) {
            std::set<IfcVector2,XYSorter> verts;
            for(size_t n = 0; n < 4; ++n) {
                verts.insert(contour[n]);
            }
            const std::set<IfcVector2,XYSorter>::const_iterator end = verts.end();
            if (verts.find(bb.first)!=end && verts.find(bb.second)!=end
                && verts.find(IfcVector2(bb.first.x,bb.second.y))!=end
                && verts.find(IfcVector2(bb.second.x,bb.first.y))!=end
                ) {
                    continue;
            }
        }

        const IfcFloat diag = (bb.first-bb.second).Length();
        const IfcFloat epsilon = diag/1000.f;

        // walk through all contour points and find those that lie on the BB corner
        size_t last_hit = -1, very_first_hit = -1;
        IfcVector2 edge;
        for(size_t n = 0, e=0, size = contour.size();; n=(n+1)%size, ++e) {

            // sanity checking
            if (e == size*2) {
                IFCImporter::LogError("encountered unexpected topology while generating window contour");
                break;
            }

            const IfcVector2& v = contour[n];

            bool hit = false;
            if (std::fabs(v.x-bb.first.x)<epsilon) {
                edge.x = bb.first.x;
                hit = true;
            }
            else if (std::fabs(v.x-bb.second.x)<epsilon) {
                edge.x = bb.second.x;
                hit = true;
            }

            if (std::fabs(v.y-bb.first.y)<epsilon) {
                edge.y = bb.first.y;
                hit = true;
            }
            else if (std::fabs(v.y-bb.second.y)<epsilon) {
                edge.y = bb.second.y;
                hit = true;
            }

            if (hit) {
                if (last_hit != (size_t)-1) {

                    const size_t old = curmesh.mVerts.size();
                    size_t cnt = last_hit > n ? size-(last_hit-n) : n-last_hit;
                    for(size_t a = last_hit, e = 0; e <= cnt; a=(a+1)%size, ++e) {
                        // hack: this is to fix cases where opening contours are self-intersecting.
                        // Clipper doesn't produce such polygons, but as soon as we're back in
                        // our brave new floating-point world, very small distances are consumed
                        // by the maximum available precision, leading to self-intersecting
                        // polygons. This fix makes concave windows fail even worse, but
                        // anyway, fail is fail.
                        if ((contour[a] - edge).SquareLength() > diag*diag*0.7) {
                            continue;
                        }
                        curmesh.mVerts.push_back(IfcVector3(contour[a].x, contour[a].y, 0.0f));
                    }

                    if (edge != contour[last_hit]) {

                        IfcVector2 corner = edge;

                        if (std::fabs(contour[last_hit].x-bb.first.x)<epsilon) {
                            corner.x = bb.first.x;
                        }
                        else if (std::fabs(contour[last_hit].x-bb.second.x)<epsilon) {
                            corner.x = bb.second.x;
                        }

                        if (std::fabs(contour[last_hit].y-bb.first.y)<epsilon) {
                            corner.y = bb.first.y;
                        }
                        else if (std::fabs(contour[last_hit].y-bb.second.y)<epsilon) {
                            corner.y = bb.second.y;
                        }

                        curmesh.mVerts.push_back(IfcVector3(corner.x, corner.y, 0.0f));
                    }
                    else if (cnt == 1) {
                        // avoid degenerate polygons (also known as lines or points)
                        curmesh.mVerts.erase(curmesh.mVerts.begin()+old,curmesh.mVerts.end());
                    }

                    if (const size_t d = curmesh.mVerts.size()-old) {
                        curmesh.mVertcnt.push_back(static_cast<unsigned int>(d));
                        std::reverse(curmesh.mVerts.rbegin(),curmesh.mVerts.rbegin()+d);
                    }
                    if (n == very_first_hit) {
                        break;
                    }
                }
                else {
                    very_first_hit = n;
                }

                last_hit = n;
            }
        }
    }
}